

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O3

c_v256 * c_v256_from_64(c_v256 *__return_storage_ptr__,uint64_t a,uint64_t b,uint64_t c,uint64_t d)

{
  __return_storage_ptr__->u64[3] = a;
  __return_storage_ptr__->u64[2] = b;
  __return_storage_ptr__->u64[1] = c;
  __return_storage_ptr__->u64[0] = d;
  return __return_storage_ptr__;
}

Assistant:

SIMD_INLINE c_v256 c_v256_from_64(uint64_t a, uint64_t b, uint64_t c,
                                  uint64_t d) {
  c_v256 t;
  t.u64[3] = a;
  t.u64[2] = b;
  t.u64[1] = c;
  t.u64[0] = d;
  return t;
}